

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

void toml::detail::skip_comment_block<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var2;
  pointer psVar3;
  scanner_storage *other;
  pointer psVar4;
  either local_e0;
  character local_c0;
  literal local_b0;
  region local_98;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    do {
      skip_whitespace<toml::type_config>(loc,ctx);
      local_c0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cf8f0;
      local_c0.value_ = '\n';
      local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cfa08;
      local_b0.value_ = "\r\n";
      local_b0.size_ = 2;
      either::either<toml::detail::character,toml::detail::literal>(&local_e0,&local_c0,&local_b0);
      psVar3 = local_e0.others_.
               super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar4 = local_e0.others_.
                    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar3; psVar4 = psVar4 + 1
          ) {
        _Var2._M_head_impl =
             (psVar4->scanner_)._M_t.
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
        (*(_Var2._M_head_impl)->_vptr_scanner_base[2])(&local_98,_Var2._M_head_impl,loc);
        peVar1 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        if (peVar1 != (element_type *)0x0) {
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_e0.others_);
          goto LAB_00359a9d;
        }
      }
      region::region(&local_98);
      peVar1 = local_98.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      region::~region(&local_98);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&local_e0.others_);
      if (peVar1 == (element_type *)0x0) {
        return;
      }
LAB_00359a9d:
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    } while (loc->location_ <
             (ulong)((long)(peVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_start));
  }
  return;
}

Assistant:

void skip_comment_block(location& loc, const context<TC>& ctx)
{
    while( ! loc.eof())
    {
        skip_whitespace(loc, ctx);
        if(loc.current() == '#')
        {
            while( ! loc.eof())
            {
                // both CRLF and LF ends with LF.
                if(loc.current() == '\n')
                {
                    loc.advance();
                    break;
                }
            }
        }
        else if(syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
        {
            ; // an empty line. skip this also
        }
        else
        {
            // the next token is neither a comment nor empty line.
            return ;
        }
    }
    return ;
}